

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O0

void __thiscall
cmCMakePresetsGraph::PackagePreset::PackagePreset(PackagePreset *this,PackagePreset *param_1)

{
  optional<bool> oVar1;
  PackagePreset *param_1_local;
  PackagePreset *this_local;
  
  Preset::Preset(&this->super_Preset,&param_1->super_Preset);
  (this->super_Preset)._vptr_Preset = (_func_int **)&PTR__PackagePreset_0150a3e8;
  std::__cxx11::string::string((string *)&this->ConfigurePreset,(string *)&param_1->ConfigurePreset)
  ;
  (this->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> =
       (param_1->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
       super__Optional_payload_base<bool>;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Generators,&param_1->Generators);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Configurations,&param_1->Configurations);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->Variables,&param_1->Variables);
  std::__cxx11::string::string((string *)&this->ConfigFile,(string *)&param_1->ConfigFile);
  oVar1.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->VerboseOutput).super__Optional_base<bool,_true,_true>;
  this->DebugOutput =
       (_Optional_base<bool,_true,_true>)
       (param_1->DebugOutput).super__Optional_base<bool,_true,_true>;
  this->VerboseOutput =
       (optional<bool>)
       oVar1.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  std::__cxx11::string::string((string *)&this->PackageName,(string *)&param_1->PackageName);
  std::__cxx11::string::string((string *)&this->PackageVersion,(string *)&param_1->PackageVersion);
  std::__cxx11::string::string
            ((string *)&this->PackageDirectory,(string *)&param_1->PackageDirectory);
  std::__cxx11::string::string((string *)&this->VendorName,(string *)&param_1->VendorName);
  return;
}

Assistant:

PackagePreset(PackagePreset&& /*other*/) = default;